

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall ThreadContext::InvalidateAllProtoInlineCaches(ThreadContext *this)

{
  int iVar1;
  Type pSVar2;
  int iVar3;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 < (this->protoInlineCacheByPropId).bucketCount; uVar4 = uVar4 + 1) {
    iVar3 = (this->protoInlineCacheByPropId).buckets[uVar4];
    if (iVar3 != -1) {
      while (iVar3 != -1) {
        pSVar2 = (this->protoInlineCacheByPropId).entries;
        iVar1 = pSVar2[iVar3].
                super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .
                super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .
                super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                .
                super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                .next;
        InvalidateAndDeleteInlineCacheList
                  (this,pSVar2[iVar3].
                        super_DefaultHashedEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                        .
                        super_KeyValueEntry<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                        .
                        super_ValueEntry<SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>_>
                        .
                        super_KeyValueEntryDataLayout2<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*>
                        .value);
        iVar3 = iVar1;
      }
    }
  }
  JsUtil::
  BaseDictionary<int,_SList<Js::InlineCache_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Reset(&this->protoInlineCacheByPropId);
  return;
}

Assistant:

void
ThreadContext::InvalidateAllProtoInlineCaches()
{
    protoInlineCacheByPropId.Map([this](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        InvalidateAndDeleteInlineCacheList(inlineCacheList);
    });
    protoInlineCacheByPropId.Reset();
}